

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O1

void xsurv0_sock_getq_cb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  int iVar2;
  nni_msg *m;
  void *item;
  
  aio = (nni_aio *)((long)arg + 0x18);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    return;
  }
  m = nni_aio_get_msg(aio);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x1f0));
  for (item = nni_list_first((nni_list *)arg); item != (void *)0x0;
      item = nni_list_next((nni_list *)arg,item)) {
    nni_msg_clone(m);
    iVar2 = nni_msgq_tryput(*(nni_msgq **)((long)item + 0x10),m);
    if (iVar2 != 0) {
      nni_msg_free(m);
    }
  }
  nni_msgq_aio_get(*(nni_msgq **)((long)arg + 0x1e0),aio);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x1f0));
  nni_msg_free(m);
  return;
}

Assistant:

static void
xsurv0_sock_getq_cb(void *arg)
{
	xsurv0_sock *s = arg;
	xsurv0_pipe *p;
	nni_msg     *msg;

	if (nni_aio_result(&s->aio_getq) != 0) {
		// Should be NNG_ECLOSED.
		return;
	}
	msg = nni_aio_get_msg(&s->aio_getq);
	nni_aio_set_msg(&s->aio_getq, NULL);

	nni_mtx_lock(&s->mtx);
	NNI_LIST_FOREACH (&s->pipes, p) {
		nni_msg_clone(msg);
		if (nni_msgq_tryput(p->sendq, msg) != 0) {
			nni_msg_free(msg);
		}
	}

	nni_msgq_aio_get(s->uwq, &s->aio_getq);
	nni_mtx_unlock(&s->mtx);

	// If there were no pipes to send on, just toss the message.
	nni_msg_free(msg);
}